

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatasrc.c
# Opt level: O0

void skip_input_data(j_decompress_ptr cinfo,long num_bytes)

{
  long *plVar1;
  long in_RSI;
  long in_RDI;
  jpeg_source_mgr *src;
  long local_10;
  
  plVar1 = *(long **)(in_RDI + 0x28);
  local_10 = in_RSI;
  if (0 < in_RSI) {
    while (plVar1[1] < local_10) {
      local_10 = local_10 - plVar1[1];
      (*(code *)plVar1[3])(in_RDI);
    }
    *plVar1 = local_10 + *plVar1;
    plVar1[1] = plVar1[1] - local_10;
  }
  return;
}

Assistant:

METHODDEF(void)
skip_input_data(j_decompress_ptr cinfo, long num_bytes)
{
  struct jpeg_source_mgr *src = cinfo->src;

  /* Just a dumb implementation for now.  Could use fseek() except
   * it doesn't work on pipes.  Not clear that being smart is worth
   * any trouble anyway --- large skips are infrequent.
   */
  if (num_bytes > 0) {
    while (num_bytes > (long)src->bytes_in_buffer) {
      num_bytes -= (long)src->bytes_in_buffer;
      (void)(*src->fill_input_buffer) (cinfo);
      /* note we assume that fill_input_buffer will never return FALSE,
       * so suspension need not be handled.
       */
    }
    src->next_input_byte += (size_t)num_bytes;
    src->bytes_in_buffer -= (size_t)num_bytes;
  }
}